

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_general.h
# Opt level: O0

void mp::WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,2>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,SOS_1or2_Constraint<2> *sos,
               ItemNamer *vnam)

{
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  BasicStringRef<char> value_01;
  BasicStringRef<char> value_02;
  BasicStringRef<char> value_03;
  BasicWriter<char> *pBVar1;
  BasicWriter<char> *pBVar2;
  SOS_1or2_Constraint<2> *in_RSI;
  BasicWriter<char> *in_RDI;
  Bounds bnds;
  undefined7 in_stack_ffffffffffffff48;
  char in_stack_ffffffffffffff4f;
  BasicWriter<char> *this;
  BasicWriter<char> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff88;
  BasicMemoryWriter<char,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  ItemNamer *in_stack_ffffffffffffffa0;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa8;
  BasicMemoryWriter<char,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  
  this = in_RDI;
  SOS_1or2_Constraint<2>::GetTypeName();
  fmt::BasicStringRef<char>::BasicStringRef
            ((BasicStringRef<char> *)this,
             (char *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  value.size_ = in_stack_ffffffffffffff80;
  value.data_ = in_stack_ffffffffffffff78;
  fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff70,value);
  fmt::BasicWriter<char>::operator<<(this,in_stack_ffffffffffffff4f);
  SOS_1or2_Constraint<2>::get_vars(in_RSI);
  WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::vector<int,std::allocator<int>>,int>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  fmt::BasicStringRef<char>::BasicStringRef
            ((BasicStringRef<char> *)this,
             (char *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  value_00.size_ = in_stack_ffffffffffffff80;
  value_00.data_ = in_stack_ffffffffffffff78;
  fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff70,value_00);
  pBVar2 = in_RDI;
  SOS_1or2_Constraint<2>::get_weights(in_RSI);
  WriteModelItemParameters<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::vector<double,std::allocator<double>>,double>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  SOS_1or2_Constraint<2>::get_sum_of_vars_range(in_RSI);
  fmt::BasicStringRef<char>::BasicStringRef
            ((BasicStringRef<char> *)this,
             (char *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  value_01.size_ = in_stack_ffffffffffffff80;
  value_01.data_ = in_stack_ffffffffffffff78;
  fmt::BasicWriter<char>::operator<<(in_RDI,value_01);
  pBVar1 = fmt::BasicWriter<char>::operator<<(in_RDI,(double)pBVar2);
  fmt::BasicStringRef<char>::BasicStringRef
            ((BasicStringRef<char> *)this,
             (char *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  value_02.size_ = in_stack_ffffffffffffff80;
  value_02.data_ = (char *)pBVar1;
  fmt::BasicWriter<char>::operator<<(in_RDI,value_02);
  pBVar2 = fmt::BasicWriter<char>::operator<<(in_RDI,(double)pBVar2);
  fmt::BasicStringRef<char>::BasicStringRef
            ((BasicStringRef<char> *)this,
             (char *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  value_03.size_ = (size_t)pBVar2;
  value_03.data_ = (char *)pBVar1;
  fmt::BasicWriter<char>::operator<<(in_RDI,value_03);
  fmt::BasicWriter<char>::operator<<(this,in_stack_ffffffffffffff4f);
  return;
}

Assistant:

inline void WriteModelItem(Writer& wrt, const SOS_1or2_Constraint<type>& sos,
                    ItemNamer& vnam) {
  // Type 1/2 should be in the name.
  wrt << sos.GetTypeName();
  wrt << '(';
  WriteModelItem(wrt, sos.get_vars(), vnam);
  wrt << ", ";
  WriteModelItemParameters(wrt, sos.get_weights());
  auto bnds = sos.get_sum_of_vars_range();
  wrt << "; [" << bnds.lb_ << ", " << bnds.ub_ << "]";
  wrt << ')';
}